

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewEntityInputStream(xmlParserCtxtPtr ctxt,xmlEntityPtr ent)

{
  xmlResourceType local_2c;
  xmlParserCtxtPtr pxStack_28;
  xmlResourceType rtype;
  xmlParserInputPtr input;
  xmlEntityPtr ent_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ent == (xmlEntityPtr)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    if (ent->content == (xmlChar *)0x0) {
      if (ent->URI == (xmlChar *)0x0) {
        return (xmlParserInputPtr)0x0;
      }
      if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
        local_2c = XML_RESOURCE_PARAMETER_ENTITY;
      }
      else {
        local_2c = XML_RESOURCE_GENERAL_ENTITY;
      }
      pxStack_28 = (xmlParserCtxtPtr)
                   xmlLoadResource(ctxt,(char *)ent->URI,(char *)ent->ExternalID,local_2c);
    }
    else {
      pxStack_28 = (xmlParserCtxtPtr)
                   xmlCtxtNewInputFromString(ctxt,(char *)0x0,(char *)ent->content,(char *)0x0,2);
    }
    if (pxStack_28 == (xmlParserCtxtPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      (pxStack_28->node_seq).maximum = (unsigned_long)ent;
      ctxt_local = pxStack_28;
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlNewEntityInputStream(xmlParserCtxtPtr ctxt, xmlEntityPtr ent) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ent == NULL))
	return(NULL);

    if (ent->content != NULL) {
        input = xmlCtxtNewInputFromString(ctxt, NULL,
                (const char *) ent->content, NULL, XML_INPUT_BUF_STATIC);
    } else if (ent->URI != NULL) {
        xmlResourceType rtype;

        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY)
            rtype = XML_RESOURCE_PARAMETER_ENTITY;
        else
            rtype = XML_RESOURCE_GENERAL_ENTITY;

        input = xmlLoadResource(ctxt, (char *) ent->URI,
                                (char *) ent->ExternalID, rtype);
    } else {
        return(NULL);
    }

    if (input == NULL)
        return(NULL);

    input->entity = ent;

    return(input);
}